

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O0

void __thiscall
imrt::Ant::Ant(Ant *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _max_apertures,
              int _max_intensity,int initial_intensity,int _step_intensity)

{
  int iVar1;
  void *pvVar2;
  Ant *in_RCX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000020;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_00000040;
  Collimator *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  Plan *in_stack_00000068;
  int in_stack_00000090;
  int in_stack_00000098;
  int in_stack_000000a0;
  int in_stack_000000a8;
  int in_stack_000000b0;
  int in_stack_000000b8;
  char *in_stack_000000c0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff14;
  vector<double,_std::allocator<double>_> *this_00;
  
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 1);
  std::
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            *)0x142b5d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x142b70);
  in_RDI[7] = in_R8;
  *(undefined4 *)(in_RDI + 8) = in_stack_00000008;
  iVar1 = Collimator::getNbAngles((Collimator *)in_RDI[7]);
  *(int *)((long)in_RDI + 0x44) = iVar1;
  *(undefined4 *)(in_RDI + 9) = in_stack_00000020;
  *(undefined4 *)((long)in_RDI + 0x4c) = in_stack_00000010;
  pvVar2 = operator_new(0xd0);
  std::vector<double,_std::allocator<double>_>::vector(this_00,in_RSI);
  std::vector<double,_std::allocator<double>_>::vector(this_00,in_RSI);
  std::vector<double,_std::allocator<double>_>::vector(this_00,in_RSI);
  uVar3 = *(undefined4 *)(in_RDI + 9);
  Plan::Plan(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048,in_stack_00000040,in_stack_00000090,in_stack_00000098,
             in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
             in_stack_000000c0);
  *in_RDI = pvVar2;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffff14,uVar3));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffff14,uVar3));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffff14,uVar3));
  generateReference(in_RCX);
  return;
}

Assistant:

Ant::Ant (vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
       vector<Volume>& volumes, int _max_apertures, int _max_intensity, int initial_intensity,
            int _step_intensity): collimator(_collimator), n_apertures(_max_apertures), n_stations(collimator.getNbAngles()),
            max_intensity(_max_intensity), step_intensity(_step_intensity) {
    
    p = new Plan(w, Zmin, Zmax, collimator, volumes, n_apertures, max_intensity, initial_intensity, step_intensity, -1, Station::OPEN_MIN_SETUP);
    generateReference(); //Remove this if intensityLS is used
  }